

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.cpp
# Opt level: O3

LogicProgram * __thiscall
Clasp::Asp::LogicProgram::addMinimize(LogicProgram *this,weight_t prio,WeightLitSpan *lits)

{
  pointer ppMVar1;
  Atom_t AVar2;
  Min *pMVar3;
  size_t sVar4;
  WeightLit_t *pWVar5;
  Atom_t atomId;
  bool bVar6;
  undefined8 *puVar7;
  ulong uVar8;
  pointer pos;
  long lVar10;
  WeightLit_t WVar11;
  DeleteObject deleter;
  Memcpy<Potassco::WeightLit_t> local_40;
  WeightLit_t local_38;
  ulong uVar9;
  
  if ((this->super_ProgramBuilder).frozen_ == true) {
    Potassco::fail(-2,
                   "LogicProgram &Clasp::Asp::LogicProgram::addMinimize(weight_t, const Potassco::WeightLitSpan &)"
                   ,0x349,"!frozen()","Can\'t update frozen program!",0);
  }
  puVar7 = (undefined8 *)operator_new(0x18);
  bVar6 = true;
  *puVar7 = 0;
  puVar7[1] = 0;
  puVar7[2] = 0;
  WVar11 = (WeightLit_t)((ulong)puVar7 & 0xfffffffffffffffe);
  *(weight_t *)WVar11 = prio;
  pos = (this->minimize_).ebo_.buf;
  uVar9 = (ulong)(this->minimize_).ebo_.size;
  ppMVar1 = pos + uVar9;
  if (uVar9 != 0) {
    do {
      uVar8 = uVar9 >> 1;
      if (pos[uVar8]->prio < prio) {
        pos = pos + uVar8 + 1;
        uVar8 = ~uVar8 + uVar9;
      }
      uVar9 = uVar8;
    } while (0 < (long)uVar8);
  }
  if ((pos == ppMVar1) || (pMVar3 = *pos, pMVar3->prio != prio)) {
    local_40.first_ = lits->first;
    sVar4 = lits->size;
    *(weight_t *)((long)WVar11 + 0x10) = 0;
    bk_lib::pod_vector<Potassco::WeightLit_t,std::allocator<Potassco::WeightLit_t>>::
    insert_impl<unsigned_int,bk_lib::detail::Memcpy<Potassco::WeightLit_t>>
              ((pod_vector<Potassco::WeightLit_t,std::allocator<Potassco::WeightLit_t>> *)
               ((long)WVar11 + 8),*(iterator *)((long)WVar11 + 8),(uint)sVar4,&local_40);
    local_40.first_ = &local_38;
    local_38 = WVar11;
    bk_lib::
    pod_vector<Clasp::Asp::LogicProgram::Min*,std::allocator<Clasp::Asp::LogicProgram::Min*>>::
    insert_impl<unsigned_int,bk_lib::detail::Fill<Clasp::Asp::LogicProgram::Min*>>
              ((pod_vector<Clasp::Asp::LogicProgram::Min*,std::allocator<Clasp::Asp::LogicProgram::Min*>>
                *)&this->minimize_,pos,1,(Fill<Clasp::Asp::LogicProgram::Min_*> *)&local_40);
    puVar7 = (undefined8 *)((ulong)puVar7 & 0xfffffffffffffffe);
    bVar6 = false;
    *(int *)(&this->field_0x24 + (long)this->statsId_ * 0x14) =
         *(int *)(&this->field_0x24 + (long)this->statsId_ * 0x14) + 1;
  }
  else {
    local_40.first_ = lits->first;
    bk_lib::pod_vector<Potassco::WeightLit_t,std::allocator<Potassco::WeightLit_t>>::
    insert_impl<unsigned_int,bk_lib::detail::Memcpy<Potassco::WeightLit_t>>
              ((pod_vector<Potassco::WeightLit_t,std::allocator<Potassco::WeightLit_t>> *)
               &pMVar3->lits,(pMVar3->lits).ebo_.buf + (pMVar3->lits).ebo_.size,(uint)lits->size,
               &local_40);
  }
  sVar4 = lits->size;
  if (sVar4 != 0) {
    pWVar5 = lits->first;
    lVar10 = 0;
    do {
      AVar2 = *(Atom_t *)((long)&pWVar5->lit + lVar10);
      atomId = -AVar2;
      if (0 < (int)AVar2) {
        atomId = AVar2;
      }
      resize(this,atomId);
      lVar10 = lVar10 + 8;
    } while (sVar4 << 3 != lVar10);
  }
  if (bVar6 && (Min *)((ulong)puVar7 & 0xfffffffffffffffe) != (Min *)0x0) {
    DeleteObject::operator()((DeleteObject *)&local_40,(Min *)((ulong)puVar7 & 0xfffffffffffffffe));
  }
  return this;
}

Assistant:

LogicProgram& LogicProgram::addMinimize(weight_t prio, const Potassco::WeightLitSpan& lits) {
	check_not_frozen();
	SingleOwnerPtr<Min> n(new Min());
	n->prio = prio;
	MinList::iterator it = std::lower_bound(minimize_.begin(), minimize_.end(), n.get(), CmpMin());
	if (it == minimize_.end() || (*it)->prio != prio) {
		n->lits.assign(Potassco::begin(lits), Potassco::end(lits));
		minimize_.insert(it, n.get());
		n.release();
		upStat(RuleStats::Minimize);
	}
	else {
		(*it)->lits.insert((*it)->lits.end(), Potassco::begin(lits), Potassco::end(lits));
	}
	// Touch all atoms in minimize -> these are input atoms even if they won't occur in a head.
	for (Potassco::WeightLitSpan::iterator wIt = Potassco::begin(lits), end = Potassco::end(lits); wIt != end; ++wIt) {
		resize(Potassco::atom(*wIt));
	}
	return *this;
}